

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O3

ssl_open_record_t
bssl::read_v2_client_hello(SSL *ssl,size_t *out_consumed,Span<const_unsigned_char> in)

{
  undefined1 *puVar1;
  uchar *puVar2;
  SSL3_STATE *pSVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  BUF_MEM *__p;
  size_t __n;
  ssl_open_record_t sVar7;
  buf_mem_st *pbVar8;
  int iVar9;
  size_t in_R9;
  uchar *puVar10;
  byte *pbVar11;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  uint8_t msg_type;
  uint16_t challenge_length;
  uint16_t session_id_length;
  uint16_t cipher_spec_length;
  uint16_t version;
  CBS v2_client_hello;
  uint32_t cipher_spec;
  CBS cipher_specs;
  CBS challenge;
  CBB hello_body;
  ScopedCBB client_hello;
  uint8_t random [32];
  CBS session_id;
  CBB cipher_suites;
  uint8_t local_139;
  ushort local_138;
  ushort local_136;
  ushort local_134;
  uint16_t local_132;
  CBS local_130;
  uint local_11c;
  CBS local_118;
  CBS local_108;
  CBB local_f8;
  CBB local_c8;
  uint8_t local_98 [40];
  CBS local_70;
  CBB local_60;
  
  pbVar11 = in.data_;
  *out_consumed = 0;
  if ((uchar *)in.size_ < (uchar *)0x5) {
    __assert_fail("in.size() >= SSL3_RT_HEADER_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x102,
                  "ssl_open_record_t bssl::read_v2_client_hello(SSL *, size_t *, Span<const uint8_t>)"
                 );
  }
  puVar10 = (uchar *)((ulong)pbVar11[1] | (ulong)((*pbVar11 & 0x7f) << 8));
  if ((uchar *)0x1000 < puVar10) {
    iVar6 = 200;
    iVar9 = 0x106;
LAB_0014c594:
    ERR_put_error(0x10,0,iVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,iVar9);
    return ssl_open_record_error;
  }
  if ((uint)puVar10 < 3) {
    iVar6 = 199;
    iVar9 = 0x10d;
    goto LAB_0014c594;
  }
  puVar2 = puVar10 + 2;
  if ((uchar *)in.size_ < puVar2) {
    *out_consumed = (size_t)puVar2;
    return ssl_open_record_partial;
  }
  pbVar11 = pbVar11 + 2;
  in_01.size_ = (size_t)puVar10;
  in_01.data_ = pbVar11;
  local_130.data = pbVar11;
  local_130.len = (size_t)puVar10;
  bVar5 = SSLTranscript::Update
                    (&((ssl->s3->hs)._M_t.
                       super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)->transcript
                     ,in_01);
  if (!bVar5) {
    return ssl_open_record_error;
  }
  in_00.size_ = in_R9;
  in_00.data_ = puVar10;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0,(int)pbVar11,in_00);
  iVar6 = CBS_get_u8(&local_130,&local_139);
  if (((((iVar6 == 0) || (iVar6 = CBS_get_u16(&local_130,&local_132), iVar6 == 0)) ||
       (iVar6 = CBS_get_u16(&local_130,&local_134), iVar6 == 0)) ||
      (((iVar6 = CBS_get_u16(&local_130,&local_136), iVar6 == 0 ||
        (iVar6 = CBS_get_u16(&local_130,&local_138), iVar6 == 0)) ||
       ((iVar6 = CBS_get_bytes(&local_130,&local_118,(ulong)local_134), iVar6 == 0 ||
        ((iVar6 = CBS_get_bytes(&local_130,&local_70,(ulong)local_136), iVar6 == 0 ||
         (iVar6 = CBS_get_bytes(&local_130,&local_108,(ulong)local_138), iVar6 == 0)))))))) ||
     ((uchar *)local_130.len != (uchar *)0x0)) {
    iVar6 = 0x89;
    iVar9 = 0x12e;
    goto LAB_0014c594;
  }
  if (local_139 != '\x01') {
    __assert_fail("msg_type == SSL2_MT_CLIENT_HELLO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x133,
                  "ssl_open_record_t bssl::read_v2_client_hello(SSL *, size_t *, Span<const uint8_t>)"
                 );
  }
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  local_98[0x18] = '\0';
  local_98[0x19] = '\0';
  local_98[0x1a] = '\0';
  local_98[0x1b] = '\0';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  if (local_108.len != 0) {
    __n = 0x20;
    if (local_108.len < 0x20) {
      __n = local_108.len;
    }
    memcpy(local_98 + (0x20 - __n),local_108.data,__n);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_118.len;
  CBB_zero(&local_c8);
  pSVar3 = ssl->s3;
  pbVar8 = (pSVar3->hs_buf)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
  if (pbVar8 == (buf_mem_st *)0x0) {
    __p = BUF_MEM_new();
    std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)&pSVar3->hs_buf,(pointer)__p)
    ;
    pbVar8 = (ssl->s3->hs_buf)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
    if (pbVar8 == (buf_mem_st *)0x0) {
      sVar7 = ssl_open_record_error;
      goto LAB_0014c933;
    }
  }
  iVar6 = BUF_MEM_reserve(pbVar8,(SUB168(ZEXT816(0xaaaaaaaaaaaaaaab) * auVar4,8) &
                                 0xfffffffffffffffe) + 0x2b);
  sVar7 = ssl_open_record_error;
  if ((((iVar6 != 0) &&
       (pbVar8 = (ssl->s3->hs_buf)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl,
       iVar6 = CBB_init_fixed(&local_c8,(uint8_t *)pbVar8->data,pbVar8->max), iVar6 != 0)) &&
      (iVar6 = CBB_add_u8(&local_c8,'\x01'), iVar6 != 0)) &&
     (((iVar6 = CBB_add_u24_length_prefixed(&local_c8,&local_f8), iVar6 != 0 &&
       (iVar6 = CBB_add_u16(&local_f8,local_132), iVar6 != 0)) &&
      ((iVar6 = CBB_add_bytes(&local_f8,local_98,0x20), iVar6 != 0 &&
       ((iVar6 = CBB_add_u8(&local_f8,'\0'), iVar6 != 0 &&
        (iVar6 = CBB_add_u16_length_prefixed(&local_f8,&local_60), iVar6 != 0)))))))) {
    if (local_118.len != 0) {
      do {
        iVar6 = CBS_get_u24(&local_118,&local_11c);
        if (iVar6 == 0) {
          iVar9 = 0x15d;
          iVar6 = 0x89;
LAB_0014c97d:
          ERR_put_error(0x10,0,iVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                        ,iVar9);
          goto LAB_0014c933;
        }
        if (((local_11c & 0xff0000) == 0) &&
           (iVar6 = CBB_add_u16(&local_60,(uint16_t)local_11c), iVar6 == 0)) {
          iVar9 = 0x166;
          iVar6 = 0x44;
          goto LAB_0014c97d;
        }
      } while (local_118.len != 0);
    }
    iVar6 = CBB_add_u8(&local_f8,'\x01');
    if (((iVar6 == 0) || (iVar6 = CBB_add_u8(&local_f8,'\0'), iVar6 == 0)) ||
       (iVar6 = CBB_finish(&local_c8,(uint8_t **)0x0,
                           &((ssl->s3->hs_buf)._M_t.
                             super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl)->length),
       iVar6 == 0)) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                    ,0x16f);
    }
    else {
      *out_consumed = (size_t)puVar2;
      puVar1 = &ssl->s3->field_0xdc;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 4;
      sVar7 = ssl_open_record_success;
    }
  }
LAB_0014c933:
  CBB_cleanup(&local_c8);
  return sVar7;
}

Assistant:

static ssl_open_record_t read_v2_client_hello(SSL *ssl, size_t *out_consumed,
                                              Span<const uint8_t> in) {
  *out_consumed = 0;
  assert(in.size() >= SSL3_RT_HEADER_LENGTH);
  // Determine the length of the V2ClientHello.
  size_t msg_length = ((in[0] & 0x7f) << 8) | in[1];
  if (msg_length > (1024 * 4)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return ssl_open_record_error;
  }
  if (msg_length < SSL3_RT_HEADER_LENGTH - 2) {
    // Reject lengths that are too short early. We have already read
    // |SSL3_RT_HEADER_LENGTH| bytes, so we should not attempt to process an
    // (invalid) V2ClientHello which would be shorter than that.
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_LENGTH_MISMATCH);
    return ssl_open_record_error;
  }

  // Ask for the remainder of the V2ClientHello.
  if (in.size() < 2 + msg_length) {
    *out_consumed = 2 + msg_length;
    return ssl_open_record_partial;
  }

  CBS v2_client_hello = CBS(in.subspan(2, msg_length));
  // The V2ClientHello without the length is incorporated into the handshake
  // hash. This is only ever called at the start of the handshake, so hs is
  // guaranteed to be non-NULL.
  if (!ssl->s3->hs->transcript.Update(v2_client_hello)) {
    return ssl_open_record_error;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, 0 /* V2ClientHello */,
                      v2_client_hello);

  uint8_t msg_type;
  uint16_t version, cipher_spec_length, session_id_length, challenge_length;
  CBS cipher_specs, session_id, challenge;
  if (!CBS_get_u8(&v2_client_hello, &msg_type) ||
      !CBS_get_u16(&v2_client_hello, &version) ||
      !CBS_get_u16(&v2_client_hello, &cipher_spec_length) ||
      !CBS_get_u16(&v2_client_hello, &session_id_length) ||
      !CBS_get_u16(&v2_client_hello, &challenge_length) ||
      !CBS_get_bytes(&v2_client_hello, &cipher_specs, cipher_spec_length) ||
      !CBS_get_bytes(&v2_client_hello, &session_id, session_id_length) ||
      !CBS_get_bytes(&v2_client_hello, &challenge, challenge_length) ||
      CBS_len(&v2_client_hello) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return ssl_open_record_error;
  }

  // msg_type has already been checked.
  assert(msg_type == SSL2_MT_CLIENT_HELLO);

  // The client_random is the V2ClientHello challenge. Truncate or left-pad with
  // zeros as needed.
  size_t rand_len = CBS_len(&challenge);
  if (rand_len > SSL3_RANDOM_SIZE) {
    rand_len = SSL3_RANDOM_SIZE;
  }
  uint8_t random[SSL3_RANDOM_SIZE];
  OPENSSL_memset(random, 0, SSL3_RANDOM_SIZE);
  OPENSSL_memcpy(random + (SSL3_RANDOM_SIZE - rand_len), CBS_data(&challenge),
                 rand_len);

  // Write out an equivalent TLS ClientHello directly to the handshake buffer.
  size_t max_v3_client_hello = SSL3_HM_HEADER_LENGTH + 2 /* version */ +
                               SSL3_RANDOM_SIZE + 1 /* session ID length */ +
                               2 /* cipher list length */ +
                               CBS_len(&cipher_specs) / 3 * 2 +
                               1 /* compression length */ + 1 /* compression */;
  ScopedCBB client_hello;
  CBB hello_body, cipher_suites;
  if (!ssl->s3->hs_buf) {
    ssl->s3->hs_buf.reset(BUF_MEM_new());
  }
  if (!ssl->s3->hs_buf ||
      !BUF_MEM_reserve(ssl->s3->hs_buf.get(), max_v3_client_hello) ||
      !CBB_init_fixed(client_hello.get(), (uint8_t *)ssl->s3->hs_buf->data,
                      ssl->s3->hs_buf->max) ||
      !CBB_add_u8(client_hello.get(), SSL3_MT_CLIENT_HELLO) ||
      !CBB_add_u24_length_prefixed(client_hello.get(), &hello_body) ||
      !CBB_add_u16(&hello_body, version) ||
      !CBB_add_bytes(&hello_body, random, SSL3_RANDOM_SIZE) ||
      // No session id.
      !CBB_add_u8(&hello_body, 0) ||
      !CBB_add_u16_length_prefixed(&hello_body, &cipher_suites)) {
    return ssl_open_record_error;
  }

  // Copy the cipher suites.
  while (CBS_len(&cipher_specs) > 0) {
    uint32_t cipher_spec;
    if (!CBS_get_u24(&cipher_specs, &cipher_spec)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return ssl_open_record_error;
    }

    // Skip SSLv2 ciphers.
    if ((cipher_spec & 0xff0000) != 0) {
      continue;
    }
    if (!CBB_add_u16(&cipher_suites, cipher_spec)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return ssl_open_record_error;
    }
  }

  // Add the null compression scheme and finish.
  if (!CBB_add_u8(&hello_body, 1) ||  //
      !CBB_add_u8(&hello_body, 0) ||  //
      !CBB_finish(client_hello.get(), NULL, &ssl->s3->hs_buf->length)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_open_record_error;
  }

  *out_consumed = 2 + msg_length;
  ssl->s3->is_v2_hello = true;
  return ssl_open_record_success;
}